

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  sel_t *psVar9;
  bool bVar10;
  const_reference pvVar11;
  idx_t iVar12;
  SelectionVector *pSVar13;
  idx_t iVar14;
  uint uVar15;
  idx_t i_1;
  value_type rhs_offset_in_row;
  ValidityMask *lhs_validity;
  idx_t i;
  idx_t iVar16;
  idx_t local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  long local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar11 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar15 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar11;
  if (puVar1 == (unsigned_long *)0x0) {
    local_88 = 0;
    for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
      psVar6 = sel->sel_vector;
      iVar14 = iVar16;
      if (psVar6 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar6[iVar16];
      }
      psVar9 = pSVar2->sel_vector;
      iVar12 = iVar14;
      if (psVar9 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar9[iVar14];
      }
      lVar7 = *(long *)(pdVar4 + iVar14 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((uVar15 & *(byte *)(lVar7 + (col_idx >> 3))) == 0) {
LAB_008eb605:
        iVar12 = *no_match_count;
        *no_match_count = iVar12 + 1;
        no_match_sel->sel_vector[iVar12] = (sel_t)iVar14;
      }
      else {
        lVar8 = *(long *)(lVar7 + 8 + vVar5);
        if ((*(long *)(pdVar3 + iVar12 * 0x10 + 8) <= lVar8) &&
           (*(ulong *)(pdVar3 + iVar12 * 0x10) <= *(ulong *)(lVar7 + vVar5) ||
            *(long *)(pdVar3 + iVar12 * 0x10 + 8) != lVar8)) goto LAB_008eb605;
        psVar6[local_88] = (sel_t)iVar14;
        local_88 = local_88 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  else {
    local_88 = 0;
    for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
      iVar14 = iVar16;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)sel->sel_vector[iVar16];
      }
      psVar6 = pSVar2->sel_vector;
      iVar12 = iVar14;
      if (psVar6 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar6[iVar14];
      }
      bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>
                          ,iVar12);
      lVar7 = *(long *)(pdVar4 + iVar14 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((bVar10) && ((*(byte *)(lVar7 + (col_idx >> 3)) & uVar15) != 0)) {
        lVar8 = *(long *)(lVar7 + 8 + vVar5);
        if ((*(long *)(pdVar3 + iVar12 * 0x10 + 8) <= lVar8) &&
           (*(ulong *)(pdVar3 + iVar12 * 0x10) <= *(ulong *)(lVar7 + vVar5) ||
            *(long *)(pdVar3 + iVar12 * 0x10 + 8) != lVar8)) goto LAB_008eb501;
        iVar12 = local_88;
        pSVar13 = sel;
        local_88 = local_88 + 1;
      }
      else {
LAB_008eb501:
        iVar12 = *no_match_count;
        *no_match_count = iVar12 + 1;
        pSVar13 = no_match_sel;
      }
      pSVar13->sel_vector[iVar12] = (sel_t)iVar14;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  return local_88;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}